

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O3

uint64_t __thiscall nuraft::raft_server::get_current_leader_index(raft_server *this)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar4;
  ptr<raft_params> params;
  undefined1 local_48 [32];
  element_type local_28 [2];
  ulong uVar3;
  
  uVar4 = (this->precommit_index_).super___atomic_base<unsigned_long>._M_i;
  context::get_params((context *)local_48);
  if (*(char *)((long)&((element_type *)(local_48._0_8_ + 0x60))->_vptr_state_mgr + 6) == '\x01') {
    iVar2 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_log_store[0x11])();
    uVar3 = CONCAT44(extraout_var,iVar2);
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 != (element_type *)0x0) {
      iVar2 = (*peVar1->_vptr_logger[7])();
      if (5 < iVar2) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)(local_48 + 0x10),"last durable index %lu, precommit index %lu",uVar3,
                   (this->precommit_index_).super___atomic_base<unsigned_long>._M_i);
        (*peVar1->_vptr_logger[8])
                  (peVar1,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"get_current_leader_index",0x477,local_48 + 0x10);
        if ((element_type *)local_48._16_8_ != local_28) {
          operator_delete((void *)local_48._16_8_);
        }
      }
    }
    uVar4 = (this->precommit_index_).super___atomic_base<unsigned_long>._M_i;
    if (uVar3 < uVar4) {
      uVar4 = uVar3;
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  return uVar4;
}

Assistant:

uint64_t raft_server::get_current_leader_index() {
    uint64_t leader_index = precommit_index_;
    ptr<raft_params> params = ctx_->get_params();
    if (params->parallel_log_appending_) {
        // For parallel appending, take the smaller one.
        uint64_t durable_index = log_store_->last_durable_index();
        p_tr("last durable index %" PRIu64 ", precommit index %" PRIu64,
             durable_index, precommit_index_.load());
        leader_index = std::min(precommit_index_.load(), durable_index);
    }
    return leader_index;
}